

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_tostring(function *fn,int A,int pc)

{
  int pc_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  membuff_add_string(&fn->body,"if (!ttisnil(ra) && !ttisstring(ra)) {\n");
  membuff_add_fstring(&fn->body," error_code = %d;\n",0xe);
  membuff_add_string(&fn->body," goto Lraise_error;\n");
  membuff_add_string(&fn->body,"}\n");
  return;
}

Assistant:

static void emit_op_tostring(struct function *fn, int A, int pc) {
  (void)pc;
  emit_reg(fn, "ra", A);
  membuff_add_string(&fn->body, "if (!ttisnil(ra) && !ttisstring(ra)) {\n");
#if GOTO_ON_ERROR
  membuff_add_fstring(&fn->body, " error_code = %d;\n", Error_string_expected);
  membuff_add_string(&fn->body, " goto Lraise_error;\n");
#else
  membuff_add_fstring(&fn->body, " raviV_raise_error(L, %d);\n", Error_string_expected);
#endif
  membuff_add_string(&fn->body, "}\n");
}